

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

void __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::
processOnLeftSideBodyFixedBaseMomentumJacobian
          (KinDynComputationsPrivateAttributes *this,MatrixView<double> *jac)

{
  index_type iVar1;
  Rotation *pRVar2;
  Transform *this_00;
  int blockCols;
  bool bVar3;
  Transform newOutputFrame_X_oldOutputFrame;
  pointer local_2b8;
  index_type local_2b0;
  index_type local_2a8;
  index_type local_2a0;
  index_type local_298;
  pointer local_290;
  index_type local_288;
  index_type local_280;
  index_type local_278;
  index_type local_270;
  Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_0>
  local_268;
  Type local_200;
  Type local_1a8;
  Matrix6x6 newOutputFrame_X_oldOutputFrame_;
  
  iDynTree::Transform::Transform(&newOutputFrame_X_oldOutputFrame);
  if (this->m_frameVelRepr != BODY_FIXED_REPRESENTATION) {
    if (this->m_frameVelRepr == MIXED_REPRESENTATION) {
      iDynTree::FreeFloatingPos::worldBasePos();
      pRVar2 = (Rotation *)iDynTree::Transform::getRotation();
      iDynTree::Position::Zero();
      this_00 = (Transform *)&newOutputFrame_X_oldOutputFrame_;
      iDynTree::Transform::Transform(this_00,pRVar2,(Position *)&local_268);
    }
    else {
      this_00 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
    }
    iDynTree::Transform::operator=(&newOutputFrame_X_oldOutputFrame,this_00);
    iDynTree::Transform::asAdjointTransformWrench();
    bVar3 = jac->m_storageOrder == ColumnMajor;
    local_280 = jac->m_cols;
    local_290 = jac->m_storage;
    local_288 = jac->m_rows;
    iVar1 = 1;
    local_270 = iVar1;
    if (bVar3) {
      local_270 = local_288;
    }
    local_278 = local_280;
    if (bVar3) {
      local_278 = iVar1;
    }
    blockCols = (int)local_280;
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>>::
    block<int,int>(&local_1a8,&local_290,0,0,6,blockCols);
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_0>
    .m_data = local_1a8.
              super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_0>
              .m_data;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_0>
    .m_rows.m_value =
         local_1a8.
         super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_0>
         .m_rows.m_value;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_0>
    .m_cols.m_value =
         local_1a8.
         super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false>,_0>
         .m_cols.m_value;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
    .
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
    .m_data = local_1a8.
              super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
              .m_xpr.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
              .m_data;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
    .
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
    .m_rows.m_value =
         local_1a8.
         super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
         .m_xpr.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
         .m_rows.m_value;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
    .
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
    .m_cols.m_value =
         local_1a8.
         super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
         .m_xpr.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
         .m_cols.m_value;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .m_xpr.m_stride.m_outer.m_value =
         local_1a8.
         super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
         .m_xpr.m_stride.m_outer.m_value;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .m_xpr.m_stride.m_inner.m_value =
         local_1a8.
         super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
         .m_xpr.m_stride.m_inner.m_value;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .m_startRow.m_value =
         local_1a8.
         super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
         .m_startRow.m_value;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .m_startCol.m_value =
         local_1a8.
         super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
         .m_startCol.m_value;
    local_268.m_rhs.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
    .m_outerStride =
         local_1a8.
         super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,__1,_false,_true>
         .m_outerStride;
    local_2a8 = jac->m_cols;
    local_2b8 = jac->m_storage;
    local_2b0 = jac->m_rows;
    local_2a0 = iVar1;
    local_298 = local_2b0;
    if (jac->m_storageOrder != ColumnMajor) {
      local_2a0 = local_2a8;
      local_298 = iVar1;
    }
    local_268.m_lhs._0_8_ = &newOutputFrame_X_oldOutputFrame_;
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>>::
    block<int,int>(&local_200,&local_2b8,0,0,6,blockCols);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,_1,_1,false>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,_1,_1,false>,0>>
              (&local_200,&local_268);
  }
  return;
}

Assistant:

void KinDynComputations::KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedBaseMomentumJacobian(MatrixView<double> jac)
{
    Transform newOutputFrame_X_oldOutputFrame;
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return;
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        Transform & world_X_base = m_pos.worldBasePos();
        newOutputFrame_X_oldOutputFrame = Transform(world_X_base.getRotation(),Position::Zero());
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        newOutputFrame_X_oldOutputFrame = m_pos.worldBasePos();
    }

    Matrix6x6 newOutputFrame_X_oldOutputFrame_ = newOutputFrame_X_oldOutputFrame.asAdjointTransformWrench();

    int cols = jac.cols();
    toEigen(jac).block(0,0,6,cols) = toEigen(newOutputFrame_X_oldOutputFrame_)*toEigen(jac).block(0,0,6,cols);
}